

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O1

void __thiscall amrex::StateData::setTimeLevel(StateData *this,Real time,Real dt_old,Real dt_new)

{
  TimeCenter TVar1;
  
  TVar1 = StateDescriptor::timeType(this->desc);
  if (TVar1 == Point) {
    (this->new_time).stop = time;
    (this->new_time).start = time;
    (this->old_time).stop = time - dt_old;
    (this->old_time).start = time - dt_old;
  }
  else {
    (this->new_time).start = time;
    (this->new_time).stop = dt_new + time;
    (this->old_time).start = time - dt_old;
    (this->old_time).stop = time;
  }
  return;
}

Assistant:

void
StateData::setTimeLevel (Real time,
                         Real dt_old,
                         Real dt_new)
{
    if (desc->timeType() == StateDescriptor::Point)
    {
        new_time.start = new_time.stop = time;
        old_time.start = old_time.stop = time - dt_old;
    }
    else
    {
        new_time.start = time;
        new_time.stop  = time+dt_new;
        old_time.start = time-dt_old;
        old_time.stop  = time;
    }
}